

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O3

void __thiscall NaPNSum::NaPNSum(NaPNSum *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNSum_00175a00;
  NaPetriCnInput::NaPetriCnInput(&this->main,&this->super_NaPetriNode,"main");
  NaPetriCnInput::NaPetriCnInput(&this->aux,&this->super_NaPetriNode,"aux");
  NaPetriCnOutput::NaPetriCnOutput(&this->sum,&this->super_NaPetriNode,"sum");
  NaVector::NaVector(&this->vMainGain,0);
  NaVector::NaVector(&this->vAuxGain,0);
  return;
}

Assistant:

NaPNSum::NaPNSum (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  main(this, "main"),
  aux(this, "aux"),
  sum(this, "sum")
{
    // Nothing to do
}